

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O3

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_parse(bssl *this,CBS *cbs,SSL_X509_METHOD *x509_method,CRYPTO_BUFFER_POOL *pool)

{
  _func_void_SSL_CTX_ptr *p_Var1;
  _func_bool_stack_st_CRYPTO_BUFFER_ptr *p_Var2;
  _func_void_CERT_ptr *p_Var3;
  uint8_t *puVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  SSL_CIPHER *pSVar9;
  OPENSSL_STACK *__p;
  _Head_base<0UL,_crypto_buffer_st_*,_false> p;
  size_t sVar10;
  CRYPTO_BUFFER *p_00;
  byte bVar11;
  byte bVar12;
  long default_value;
  undefined8 uVar13;
  ulong uVar14;
  CBS_ASN1_TAG extraout_EDX;
  CBS_ASN1_TAG extraout_EDX_00;
  CBS_ASN1_TAG tag;
  CBS_ASN1_TAG tag_00;
  CBS *this_00;
  ptrdiff_t _Num;
  Array<unsigned_char> *pAVar15;
  UniquePtr<SSL_SESSION> ret;
  CBS session;
  int has_peer;
  uint16_t cipher_value;
  int age_add_present;
  CBS settings;
  CBS age_add;
  int is_resumable_across_names;
  int has_peer_alps;
  int has_local_alps;
  int is_quic;
  int is_server;
  int has_cert_chain;
  int extended_master_secret;
  uint16_t unused;
  CBS child;
  CBS original_handshake_hash;
  uint64_t ssl_version;
  uint64_t timeout;
  uint64_t version;
  CBS sid_ctx;
  CBS peer;
  CBS secret;
  CBS session_id;
  CBS cipher;
  CBS unused_hostname;
  _Head_base<0UL,_ssl_session_st_*,_false> in_stack_fffffffffffffea8;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var16;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var17;
  CBS local_150;
  int local_13c;
  uint16_t local_136;
  int local_134;
  CBS local_130;
  CBS local_120;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_110;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_108;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  uint16_t local_e2;
  CBS local_e0;
  CBS local_d0;
  uint16_t local_c0;
  undefined6 uStack_be;
  CBS local_b8;
  ulong local_a0;
  uint64_t local_98;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  ssl_session_new((SSL_X509_METHOD *)in_stack_fffffffffffffea8._M_head_impl);
  if ((_Head_base<0UL,_ssl_session_st_*,_false>)in_stack_fffffffffffffea8._M_head_impl !=
      (_Head_base<0UL,_ssl_session_st_*,_false>)0x0) {
    iVar8 = CBS_get_asn1(cbs,&local_150,0x20000010);
    if ((((iVar8 == 0) || (iVar8 = CBS_get_asn1_uint64(&local_150,&local_98), iVar8 == 0)) ||
        (local_98 != 1)) ||
       ((iVar8 = CBS_get_asn1_uint64(&local_150,(uint64_t *)&local_c0),
        0xffff < CONCAT62(uStack_be,local_c0) || iVar8 == 0 ||
        (bVar5 = ssl_protocol_version_from_wire(&local_e2,local_c0), !bVar5)))) {
      ERR_put_error(0x10,0,0xa0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                    ,0x1e1);
    }
    else {
      (in_stack_fffffffffffffea8._M_head_impl)->ssl_version = local_c0;
      iVar8 = CBS_get_asn1(&local_150,&local_50,4);
      if (((iVar8 == 0) || (iVar8 = CBS_get_u16(&local_50,&local_136), iVar8 == 0)) ||
         (local_50.len != 0)) {
        ERR_put_error(0x10,0,0xa0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                      ,0x1eb);
      }
      else {
        pSVar9 = SSL_get_cipher_by_value(local_136);
        *(SSL_CIPHER **)((long)in_stack_fffffffffffffea8._M_head_impl + 0xd8) = pSVar9;
        if (pSVar9 == (SSL_CIPHER *)0x0) {
          ERR_put_error(0x10,0,0xed,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                        ,0x1f0);
        }
        else {
          iVar8 = CBS_get_asn1(&local_150,&local_60,4);
          if ((iVar8 != 0) && (local_60.len < 0x21)) {
            ((in_stack_fffffffffffffea8._M_head_impl)->session_id).size_ = '\0';
            _Var16._M_head_impl = in_stack_fffffffffffffea8._M_head_impl;
            if (local_60.len != 0) {
              memmove(&(in_stack_fffffffffffffea8._M_head_impl)->session_id,local_60.data,
                      local_60.len);
            }
            ((in_stack_fffffffffffffea8._M_head_impl)->session_id).size_ =
                 (PackedSize<32UL>)local_60.len;
            iVar8 = CBS_get_asn1(&local_150,&local_70,4);
            if ((iVar8 != 0) && (local_70.len < 0x41)) {
              ((_Var16._M_head_impl)->secret).size_ = '\0';
              _Var17._M_head_impl = _Var16._M_head_impl;
              if (local_70.len != 0) {
                memmove(&(_Var16._M_head_impl)->secret,local_70.data,local_70.len);
              }
              ((_Var16._M_head_impl)->secret).size_ = (PackedSize<64UL>)local_70.len;
              iVar8 = CBS_get_asn1(&local_150,&local_e0,0xa0000001);
              if ((((iVar8 != 0) &&
                   (iVar8 = CBS_get_asn1_uint64(&local_e0,
                                                (uint64_t *)((long)_Var17._M_head_impl + 0xd0)),
                   iVar8 != 0)) &&
                  (iVar8 = CBS_get_asn1(&local_150,&local_e0,0xa0000002), iVar8 != 0)) &&
                 (iVar8 = CBS_get_asn1_uint64(&local_e0,&local_a0),
                 local_a0 >> 0x20 == 0 && iVar8 != 0)) {
                (_Var17._M_head_impl)->timeout = (uint32_t)local_a0;
                iVar8 = CBS_get_optional_asn1(&local_150,&local_80,&local_13c,0xa0000003);
                if ((iVar8 == 0) || ((local_13c != 0 && (local_80.len == 0)))) {
                  ERR_put_error(0x10,0,0xa0,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                ,0x209);
                }
                else {
                  default_value = 0xa0000004;
                  iVar8 = CBS_get_optional_asn1_octet_string
                                    (&local_150,&local_90,(int *)0x0,0xa0000004);
                  if ((iVar8 != 0) && (local_90.len < 0x21)) {
                    *(PackedSize<32UL> *)((long)_Var17._M_head_impl + 0x8c) = '\0';
                    tag = extraout_EDX;
                    _Var16._M_head_impl = _Var17._M_head_impl;
                    if (local_90.len != 0) {
                      memmove((InplaceVector<unsigned_char,_32UL> *)
                              ((long)_Var17._M_head_impl + 0x6c),local_90.data,local_90.len);
                      tag = extraout_EDX_00;
                    }
                    *(PackedSize<32UL> *)((long)_Var17._M_head_impl + 0x8c) =
                         (PackedSize<32UL>)local_90.len;
                    iVar8 = SSL_SESSION_parse_long
                                      (&local_150,(long *)((long)_Var17._M_head_impl + 0xc0),tag,
                                       default_value);
                    if (iVar8 != 0) {
                      iVar8 = CBS_get_optional_asn1(&local_150,&local_40,(int *)0x0,0xa0000006);
                      if (iVar8 == 0) {
                        ERR_put_error(0x10,0,0xa0,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                      ,0x21b);
                      }
                      else {
                        iVar8 = SSL_SESSION_parse_string
                                          (&local_150,
                                           (UniquePtr<char> *)((long)_Var16._M_head_impl + 0x90),
                                           tag_00);
                        if (((iVar8 != 0) &&
                            (iVar8 = SSL_SESSION_parse_u32
                                               (&local_150,
                                                &(_Var16._M_head_impl)->ticket_lifetime_hint,
                                                0xa0000009,0), iVar8 != 0)) &&
                           (bVar5 = SSL_SESSION_parse_octet_string
                                              (&local_150,
                                               (Array<unsigned_char> *)
                                               ((long)_Var16._M_head_impl + 0xf8),0xa000000a), bVar5
                           )) {
                          iVar8 = CBS_peek_asn1_tag(&local_150,0xa000000d);
                          if (iVar8 == 0) {
                            *(byte *)((long)_Var16._M_head_impl + 0x1b8) =
                                 *(byte *)((long)_Var16._M_head_impl + 0x1b8) & 0xfd;
                          }
                          else {
                            iVar8 = CBS_get_asn1(&local_150,&local_e0,0xa000000d);
                            if (((iVar8 == 0) ||
                                (iVar8 = CBS_get_asn1(&local_e0,&local_d0,4), iVar8 == 0)) ||
                               ((local_d0.len != 0x20 || (local_e0.len != 0)))) {
                              ERR_put_error(0x10,0,0xa0,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                            ,0x22d);
                              goto LAB_0014bb2b;
                            }
                            p_Var1 = *(_func_void_SSL_CTX_ptr **)local_d0.data;
                            p_Var2 = *(_func_bool_stack_st_CRYPTO_BUFFER_ptr **)(local_d0.data + 8);
                            p_Var3 = *(_func_void_CERT_ptr **)(local_d0.data + 0x18);
                            *(_func_void_CERT_ptr **)((long)_Var16._M_head_impl + 0x128) =
                                 *(_func_void_CERT_ptr **)(local_d0.data + 0x10);
                            *(_func_void_CERT_ptr **)((long)_Var16._M_head_impl + 0x130) = p_Var3;
                            *(_func_void_SSL_CTX_ptr **)((long)_Var16._M_head_impl + 0x118) = p_Var1
                            ;
                            ((SSL_X509_METHOD *)((long)_Var16._M_head_impl + 0x120))->check_CA_list
                                 = p_Var2;
                            *(byte *)((long)_Var16._M_head_impl + 0x1b8) =
                                 *(byte *)((long)_Var16._M_head_impl + 0x1b8) | 2;
                          }
                          iVar8 = CBS_get_optional_asn1_octet_string
                                            (&local_150,&local_d0,(int *)0x0,0xa000000e);
                          if ((iVar8 != 0) && (local_d0.len < 0x41)) {
                            *(undefined1 *)((long)_Var16._M_head_impl + 0x178) = 0;
                            _Var17._M_head_impl = _Var16._M_head_impl;
                            if (local_d0.len != 0) {
                              memmove((InplaceVector<unsigned_char,_64UL> *)
                                      ((long)_Var16._M_head_impl + 0x138),local_d0.data,local_d0.len
                                     );
                            }
                            *(char *)((long)_Var16._M_head_impl + 0x178) = (char)local_d0.len;
                            iVar8 = SSL_SESSION_parse_crypto_buffer
                                              (&local_150,
                                               (UniquePtr<CRYPTO_BUFFER> *)
                                               ((long)_Var16._M_head_impl + 0x108),0xa000000f,pool);
                            if ((iVar8 != 0) &&
                               (iVar8 = SSL_SESSION_parse_crypto_buffer
                                                  (&local_150,
                                                   (UniquePtr<CRYPTO_BUFFER> *)
                                                   ((long)_Var17._M_head_impl + 0x110),0xa0000010,
                                                   pool), iVar8 != 0)) {
                              uVar13 = 0;
                              iVar8 = CBS_get_optional_asn1_bool(&local_150,&local_e8,0xa0000011,0);
                              if (iVar8 == 0) {
                                ERR_put_error(0x10,0,0xa0,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                              ,0x248);
                              }
                              else {
                                uVar14 = CONCAT71((int7)((ulong)uVar13 >> 8),
                                                  *(undefined1 *)((long)_Var17._M_head_impl + 0x1b8)
                                                 ) & 0xfffffffffffffffe;
                                bVar11 = (byte)uVar14 | local_e8 != 0;
                                *(byte *)((long)_Var17._M_head_impl + 0x1b8) = bVar11;
                                iVar8 = SSL_SESSION_parse_u16
                                                  (&local_150,
                                                   (uint16_t *)((long)_Var17._M_head_impl + 6),
                                                   0xa0000012,
                                                   (uint16_t)CONCAT71((int7)(uVar14 >> 8),bVar11));
                                if (iVar8 == 0) {
                                  ERR_put_error(0x10,0,0xa0,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                ,0x24e);
                                }
                                else {
                                  local_b8.data = (uint8_t *)0x0;
                                  local_b8.len = 0;
                                  iVar8 = CBS_get_optional_asn1
                                                    (&local_150,&local_b8,&local_ec,0xa0000013);
                                  if (iVar8 == 0) {
LAB_0014bf7d:
                                    ERR_put_error(0x10,0,0xa0,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,600);
                                  }
                                  else {
                                    if (local_ec != 0) {
                                      if (local_b8.len == 0) goto LAB_0014bf7d;
                                      if (local_13c == 0) {
                                        ERR_put_error(0x10,0,0xa0,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x25c);
                                        goto LAB_0014bb2b;
                                      }
                                    }
                                    if (local_13c != 0 || local_ec != 0) {
                                      _Var16._M_head_impl = _Var17._M_head_impl;
                                      __p = OPENSSL_sk_new_null();
                                      std::
                                      __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                      ::reset((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                               *)((long)_Var17._M_head_impl + 0x98),(pointer)__p);
                                      if ((((UniquePtr<struct_stack_st_CRYPTO_BUFFER> *)
                                           ((long)_Var16._M_head_impl + 0x98))->_M_t).
                                          super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>.
                                          _M_head_impl == (stack_st_CRYPTO_BUFFER *)0x0)
                                      goto LAB_0014bb2b;
                                      _Var17._M_head_impl = _Var16._M_head_impl;
                                      if (local_13c != 0) {
                                        p._M_head_impl = CRYPTO_BUFFER_new_from_CBS(&local_80,pool);
                                        local_120.data = (uint8_t *)p._M_head_impl;
                                        if ((_Head_base<0UL,_crypto_buffer_st_*,_false>)
                                            p._M_head_impl !=
                                            (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
                                          local_120.data = (uint8_t *)0x0;
                                          local_108._M_t.
                                          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                          _M_head_impl = (
                                                  tuple<crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  )(
                                                  tuple<crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  )p._M_head_impl;
                                          sVar10 = OPENSSL_sk_push((OPENSSL_STACK *)
                                                                   (((
                                                  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *)
                                                  ((long)_Var16._M_head_impl + 0x98))->_M_t).
                                                  super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                                  .
                                                  super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>
                                                  ._M_head_impl,p._M_head_impl);
                                          if (sVar10 != 0) {
                                            local_108._M_t.
                                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_crypto_buffer_st_*,_false>.
                                            _M_head_impl = (
                                                  tuple<crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  )(
                                                  _Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                                  )0x0;
                                            std::
                                            unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                            ~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)&local_108);
                                            std::
                                            unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                            ~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)&local_120);
                                            _Var17._M_head_impl = _Var16._M_head_impl;
                                            goto LAB_0014c043;
                                          }
                                          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                          ::~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)&local_108);
                                        }
                                        *(undefined8 *)this = 0;
                                        this_00 = &local_120;
LAB_0014c477:
                                        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                        ~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)this_00);
                                        goto LAB_0014bb32;
                                      }
LAB_0014c043:
                                      if (local_b8.len != 0) {
                                        do {
                                          iVar8 = CBS_get_any_asn1_element
                                                            (&local_b8,&local_120,
                                                             (CBS_ASN1_TAG *)0x0,(size_t *)0x0);
                                          if ((iVar8 == 0) || (local_120.len == 0)) {
                                            ERR_put_error(0x10,0,0xa0,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x271);
                                            goto LAB_0014bb2b;
                                          }
                                          p_00 = CRYPTO_BUFFER_new_from_CBS(&local_120,pool);
                                          local_130.data = (uint8_t *)p_00;
                                          if (p_00 == (CRYPTO_BUFFER *)0x0) {
LAB_0014c46b:
                                            *(undefined8 *)this = 0;
                                            this_00 = &local_130;
                                            goto LAB_0014c477;
                                          }
                                          local_130.data = (uint8_t *)0x0;
                                          local_110._M_head_impl = p_00;
                                          sVar10 = OPENSSL_sk_push((OPENSSL_STACK *)
                                                                   (((
                                                  UniquePtr<struct_stack_st_CRYPTO_BUFFER> *)
                                                  ((long)_Var17._M_head_impl + 0x98))->_M_t).
                                                  super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                                  .
                                                  super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>
                                                  ._M_head_impl,p_00);
                                          if (sVar10 == 0) {
                                            std::
                                            unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::
                                            ~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)&local_110);
                                            goto LAB_0014c46b;
                                          }
                                          local_110._M_head_impl = (CRYPTO_BUFFER *)0x0;
                                          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                          ::~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)&local_110);
                                          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                          ::~unique_ptr((
                                                  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>
                                                  *)&local_130);
                                        } while (local_b8.len != 0);
                                      }
                                    }
                                    iVar8 = CBS_get_optional_asn1_octet_string
                                                      (&local_150,&local_120,&local_134,0xa0000015);
                                    if (iVar8 != 0) {
                                      if (local_134 == 0) {
                                        if (local_120.len == 0) {
                                          bVar11 = 0;
                                          goto LAB_0014c15e;
                                        }
                                      }
                                      else {
                                        iVar8 = CBS_get_u32(&local_120,
                                                            &(_Var17._M_head_impl)->ticket_age_add);
                                        if ((iVar8 != 0) && (local_120.len == 0)) {
                                          bVar11 = (local_134 != 0) << 3;
LAB_0014c15e:
                                          (_Var17._M_head_impl)->field_0x1b8 =
                                               (_Var17._M_head_impl)->field_0x1b8 & 0xf7 | bVar11;
                                          uVar13 = 0;
                                          iVar8 = CBS_get_optional_asn1_bool
                                                            (&local_150,&local_f0,0xa0000016,1);
                                          if (iVar8 == 0) {
                                            ERR_put_error(0x10,0,0xa0,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x28b);
                                          }
                                          else {
                                            uVar14 = CONCAT71((int7)((ulong)uVar13 >> 8),
                                                              *(undefined1 *)
                                                               ((long)_Var17._M_head_impl + 0x1b8))
                                                     & 0xffffffffffffffef;
                                            bVar11 = (byte)uVar14 | (local_f0 != 0) << 4;
                                            *(byte *)((long)_Var17._M_head_impl + 0x1b8) = bVar11;
                                            iVar8 = SSL_SESSION_parse_u16
                                                              (&local_150,
                                                               (uint16_t *)
                                                               ((long)_Var17._M_head_impl + 8),
                                                               0xa0000017,
                                                               (uint16_t)
                                                               CONCAT71((int7)(uVar14 >> 8),bVar11))
                                            ;
                                            if (((((iVar8 == 0) ||
                                                  (iVar8 = SSL_SESSION_parse_u32
                                                                     (&local_150,
                                                                      &(_Var17._M_head_impl)->
                                                                       ticket_max_early_data,
                                                                      0xa0000018,0), iVar8 == 0)) ||
                                                 (iVar8 = SSL_SESSION_parse_u32
                                                                    (&local_150,
                                                                     (uint32_t *)
                                                                     ((long)_Var17._M_head_impl +
                                                                     0xcc),0xa0000019,
                                                                     *(uint32_t *)
                                                                      ((long)_Var17._M_head_impl +
                                                                      200)), iVar8 == 0)) ||
                                                ((bVar5 = SSL_SESSION_parse_octet_string
                                                                    (&local_150,
                                                                     &(_Var17._M_head_impl)->
                                                                      early_alpn,0xa000001a), !bVar5
                                                 || (iVar8 = CBS_get_optional_asn1_bool
                                                                       (&local_150,&local_f4,
                                                                        0xa000001b,0), iVar8 == 0)))
                                                ) || (bVar5 = SSL_SESSION_parse_octet_string
                                                                        (&local_150,
                                                                         (Array<unsigned_char> *)
                                                                         ((long)_Var17._M_head_impl
                                                                         + 0x1c0),0xa000001c),
                                                     !bVar5)) {
                                              ERR_put_error(0x10,0,0xa0,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2a0);
                                            }
                                            else {
                                              iVar8 = CBS_get_optional_asn1_octet_string
                                                                (&local_150,&local_130,&local_f8,
                                                                 0xa000001d);
                                              sVar10 = local_130.len;
                                              puVar4 = local_130.data;
                                              if (iVar8 != 0) {
                                                pAVar15 = &(_Var17._M_head_impl)->
                                                           local_application_settings;
                                                bVar5 = Array<unsigned_char>::InitUninitialized
                                                                  (pAVar15,local_130.len);
                                                if (bVar5 && sVar10 != 0) {
                                                  memmove(pAVar15->data_,puVar4,sVar10);
                                                }
                                                if ((bVar5) &&
                                                   (iVar8 = CBS_get_optional_asn1_octet_string
                                                                      (&local_150,&local_130,
                                                                       &local_fc,0xa000001e),
                                                   puVar4 = local_130.data, iVar8 != 0)) {
                                                  pAVar15 = &(_Var17._M_head_impl)->
                                                             peer_application_settings;
                                                  bVar5 = Array<unsigned_char>::InitUninitialized
                                                                    (pAVar15,local_130.len);
                                                  if (bVar5 && local_130.len != 0) {
                                                    memmove(pAVar15->data_,puVar4,local_130.len);
                                                  }
                                                  if (((bVar5) &&
                                                      (iVar8 = CBS_get_optional_asn1_bool
                                                                         (&local_150,&local_100,
                                                                          0xa000001f,0), iVar8 != 0)
                                                      ) && (local_150.len == 0)) {
                                                    bVar11 = (_Var17._M_head_impl)->field_0x1b8;
                                                    bVar6 = (local_f4 != 0) << 5;
                                                    bVar7 = (local_100 != 0) << 7;
                                                    (_Var17._M_head_impl)->field_0x1b8 =
                                                         bVar7 | bVar11 & 0x5f | bVar6;
                                                    if (local_f8 == local_fc) {
                                                      if (local_f8 == 0) {
                                                        bVar12 = 0;
                                                      }
                                                      else {
                                                        bVar12 = 0x40;
                                                        if (((_Var17._M_head_impl)->early_alpn).
                                                            size_ == 0) goto LAB_0014c3c2;
                                                      }
                                                      (_Var17._M_head_impl)->field_0x1b8 =
                                                           bVar7 | bVar11 & 0x1f | bVar6 | bVar12;
                                                      bVar5 = (*x509_method->session_cache_objects)
                                                                        (_Var17._M_head_impl);
                                                      if (bVar5) {
                                                        *(ssl_session_st **)this =
                                                             _Var17._M_head_impl;
                                                        goto LAB_0014bb32;
                                                      }
                                                      ERR_put_error(0x10,0,0xa0,
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2bf);
                                                  }
                                                  else {
LAB_0014c3c2:
                                                    ERR_put_error(0x10,0,0xa0,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2b9);
                                                  }
                                                  goto LAB_0014bb2b;
                                                  }
                                                }
                                              }
                                              ERR_put_error(0x10,0,0xa0,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                                                  ,0x2b0);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0014bb2b;
              }
            }
          }
          ERR_put_error(0x10,0,0xa0,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                        ,0x1ff);
        }
      }
    }
  }
LAB_0014bb2b:
  *(undefined8 *)this = 0;
LAB_0014bb32:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&stack0xfffffffffffffea8);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_parse(CBS *cbs,
                                         const SSL_X509_METHOD *x509_method,
                                         CRYPTO_BUFFER_POOL *pool) {
  UniquePtr<SSL_SESSION> ret = ssl_session_new(x509_method);
  if (!ret) {
    return nullptr;
  }

  CBS session;
  uint64_t version, ssl_version;
  uint16_t unused;
  if (!CBS_get_asn1(cbs, &session, CBS_ASN1_SEQUENCE) ||  //
      !CBS_get_asn1_uint64(&session, &version) ||         //
      version != kVersion ||                              //
      !CBS_get_asn1_uint64(&session, &ssl_version) ||     //
      // Require sessions have versions valid in either TLS or DTLS. The session
      // will not be used by the handshake if not applicable, but, for
      // simplicity, never parse a session that does not pass
      // |ssl_protocol_version_from_wire|.
      ssl_version > UINT16_MAX ||  //
      !ssl_protocol_version_from_wire(&unused, ssl_version)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->ssl_version = ssl_version;

  CBS cipher;
  uint16_t cipher_value;
  if (!CBS_get_asn1(&session, &cipher, CBS_ASN1_OCTETSTRING) ||  //
      !CBS_get_u16(&cipher, &cipher_value) ||                    //
      CBS_len(&cipher) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->cipher = SSL_get_cipher_by_value(cipher_value);
  if (ret->cipher == NULL) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNSUPPORTED_CIPHER);
    return nullptr;
  }

  CBS session_id, secret, child;
  uint64_t timeout;
  if (!CBS_get_asn1(&session, &session_id, CBS_ASN1_OCTETSTRING) ||
      !ret->session_id.TryCopyFrom(session_id) ||
      !CBS_get_asn1(&session, &secret, CBS_ASN1_OCTETSTRING) ||
      !ret->secret.TryCopyFrom(secret) ||
      !CBS_get_asn1(&session, &child, kTimeTag) ||
      !CBS_get_asn1_uint64(&child, &ret->time) ||
      !CBS_get_asn1(&session, &child, kTimeoutTag) ||
      !CBS_get_asn1_uint64(&child, &timeout) ||  //
      timeout > UINT32_MAX) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  ret->timeout = (uint32_t)timeout;

  CBS peer;
  int has_peer;
  if (!CBS_get_optional_asn1(&session, &peer, &has_peer, kPeerTag) ||
      (has_peer && CBS_len(&peer) == 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  // |peer| is processed with the certificate chain.

  CBS sid_ctx;
  if (!CBS_get_optional_asn1_octet_string(
          &session, &sid_ctx, /*out_present=*/nullptr, kSessionIDContextTag) ||
      !ret->sid_ctx.TryCopyFrom(sid_ctx) ||
      !SSL_SESSION_parse_long(&session, &ret->verify_result, kVerifyResultTag,
                              X509_V_OK)) {
    return nullptr;
  }

  // Skip the historical hostName field.
  CBS unused_hostname;
  if (!CBS_get_optional_asn1(&session, &unused_hostname, nullptr,
                             kHostNameTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  if (!SSL_SESSION_parse_string(&session, &ret->psk_identity,
                                kPSKIdentityTag) ||
      !SSL_SESSION_parse_u32(&session, &ret->ticket_lifetime_hint,
                             kTicketLifetimeHintTag, 0) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->ticket, kTicketTag)) {
    return nullptr;
  }

  if (CBS_peek_asn1_tag(&session, kPeerSHA256Tag)) {
    CBS peer_sha256;
    if (!CBS_get_asn1(&session, &child, kPeerSHA256Tag) ||
        !CBS_get_asn1(&child, &peer_sha256, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&peer_sha256) != sizeof(ret->peer_sha256) ||
        CBS_len(&child) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
      return nullptr;
    }
    OPENSSL_memcpy(ret->peer_sha256, CBS_data(&peer_sha256),
                   sizeof(ret->peer_sha256));
    ret->peer_sha256_valid = true;
  } else {
    ret->peer_sha256_valid = false;
  }

  CBS original_handshake_hash;
  if (!CBS_get_optional_asn1_octet_string(&session, &original_handshake_hash,
                                          /*out_present=*/nullptr,
                                          kOriginalHandshakeHashTag) ||
      !ret->original_handshake_hash.TryCopyFrom(original_handshake_hash) ||
      !SSL_SESSION_parse_crypto_buffer(&session,
                                       &ret->signed_cert_timestamp_list,
                                       kSignedCertTimestampListTag, pool) ||
      !SSL_SESSION_parse_crypto_buffer(&session, &ret->ocsp_response,
                                       kOCSPResponseTag, pool)) {
    return nullptr;
  }

  int extended_master_secret;
  if (!CBS_get_optional_asn1_bool(&session, &extended_master_secret,
                                  kExtendedMasterSecretTag,
                                  0 /* default to false */)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->extended_master_secret = !!extended_master_secret;

  if (!SSL_SESSION_parse_u16(&session, &ret->group_id, kGroupIDTag, 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  CBS cert_chain;
  CBS_init(&cert_chain, NULL, 0);
  int has_cert_chain;
  if (!CBS_get_optional_asn1(&session, &cert_chain, &has_cert_chain,
                             kCertChainTag) ||
      (has_cert_chain && CBS_len(&cert_chain) == 0)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  if (has_cert_chain && !has_peer) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  if (has_peer || has_cert_chain) {
    ret->certs.reset(sk_CRYPTO_BUFFER_new_null());
    if (ret->certs == nullptr) {
      return nullptr;
    }

    if (has_peer) {
      UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new_from_CBS(&peer, pool));
      if (!buffer ||  //
          !PushToStack(ret->certs.get(), std::move(buffer))) {
        return nullptr;
      }
    }

    while (CBS_len(&cert_chain) > 0) {
      CBS cert;
      if (!CBS_get_any_asn1_element(&cert_chain, &cert, NULL, NULL) ||
          CBS_len(&cert) == 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
        return nullptr;
      }

      UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new_from_CBS(&cert, pool));
      if (buffer == nullptr ||
          !PushToStack(ret->certs.get(), std::move(buffer))) {
        return nullptr;
      }
    }
  }

  CBS age_add;
  int age_add_present;
  if (!CBS_get_optional_asn1_octet_string(&session, &age_add, &age_add_present,
                                          kTicketAgeAddTag) ||
      (age_add_present &&                                //
       !CBS_get_u32(&age_add, &ret->ticket_age_add)) ||  //
      CBS_len(&age_add) != 0) {
    return nullptr;
  }
  ret->ticket_age_add_valid = age_add_present != 0;

  int is_server;
  if (!CBS_get_optional_asn1_bool(&session, &is_server, kIsServerTag,
                                  1 /* default to true */)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  /* TODO: in time we can include |is_server| for servers too, then we can
     enforce that client and server sessions are never mixed up. */

  ret->is_server = is_server;

  int is_quic;
  if (!SSL_SESSION_parse_u16(&session, &ret->peer_signature_algorithm,
                             kPeerSignatureAlgorithmTag, 0) ||
      !SSL_SESSION_parse_u32(&session, &ret->ticket_max_early_data,
                             kTicketMaxEarlyDataTag, 0) ||
      !SSL_SESSION_parse_u32(&session, &ret->auth_timeout, kAuthTimeoutTag,
                             ret->timeout) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->early_alpn,
                                      kEarlyALPNTag) ||
      !CBS_get_optional_asn1_bool(&session, &is_quic, kIsQuicTag,
                                  /*default_value=*/false) ||
      !SSL_SESSION_parse_octet_string(&session, &ret->quic_early_data_context,
                                      kQuicEarlyDataContextTag)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  CBS settings;
  int has_local_alps, has_peer_alps, is_resumable_across_names;
  if (!CBS_get_optional_asn1_octet_string(&session, &settings, &has_local_alps,
                                          kLocalALPSTag) ||
      !ret->local_application_settings.CopyFrom(settings) ||
      !CBS_get_optional_asn1_octet_string(&session, &settings, &has_peer_alps,
                                          kPeerALPSTag) ||
      !ret->peer_application_settings.CopyFrom(settings) ||
      !CBS_get_optional_asn1_bool(&session, &is_resumable_across_names,
                                  kResumableAcrossNamesTag,
                                  /*default_value=*/false) ||
      CBS_len(&session) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->is_quic = is_quic;
  ret->is_resumable_across_names = is_resumable_across_names;

  // The two ALPS values and ALPN must be consistent.
  if (has_local_alps != has_peer_alps ||
      (has_local_alps && ret->early_alpn.empty())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }
  ret->has_application_settings = has_local_alps;

  if (!x509_method->session_cache_objects(ret.get())) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return nullptr;
  }

  return ret;
}